

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gridtestTestFunctions.cpp
# Opt level: O0

void __thiscall SixteenOneActive3::getDerivative(SixteenOneActive3 *this,double *x,double *y)

{
  double dVar1;
  double dVar2;
  int local_24;
  int i;
  double *y_local;
  double *x_local;
  SixteenOneActive3 *this_local;
  
  for (local_24 = 0; local_24 < 0x10; local_24 = local_24 + 1) {
    y[local_24] = 0.0;
  }
  dVar1 = sin(x[3] + x[0xf]);
  y[2] = dVar1;
  dVar1 = x[2];
  dVar2 = cos(x[3] + x[0xf]);
  y[3] = dVar1 * dVar2;
  dVar1 = x[2];
  dVar2 = cos(x[3] + x[0xf]);
  y[0xf] = dVar1 * dVar2;
  return;
}

Assistant:

void SixteenOneActive3::getDerivative(const double x[], double y[]) const{
    for (int i=0; i<16; i++)
        y[i] = 0.0;
    y[2] = std::sin(x[3] + x[15]);
    y[3] = x[2] * std::cos(x[3] + x[15]);
    y[15] = x[2] * std::cos(x[3] + x[15]);
}